

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

void NGA_Access_ghosts64(int g_a,int64_t *dims,void *ptr,int64_t *ld)

{
  Integer IVar1;
  long lVar2;
  long lVar3;
  int64_t *piVar4;
  Integer *pIVar5;
  Integer _ga_work [7];
  Integer _ga_lo [7];
  Integer local_a8 [8];
  Integer local_68 [8];
  
  IVar1 = pnga_ndim((long)g_a);
  pnga_access_ghost_ptr((long)g_a,local_68,ptr,local_a8);
  lVar3 = 0;
  lVar2 = IVar1 + -1;
  if (IVar1 + -1 < 1) {
    lVar2 = lVar3;
  }
  piVar4 = ld + IVar1 + -2;
  for (; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *piVar4 = local_a8[lVar3];
    piVar4 = piVar4 + -1;
  }
  lVar3 = 0;
  lVar2 = 0;
  if (0 < IVar1) {
    lVar2 = IVar1;
  }
  pIVar5 = dims + IVar1;
  for (; pIVar5 = pIVar5 + -1, lVar2 != lVar3; lVar3 = lVar3 + 1) {
    *pIVar5 = local_68[lVar3];
  }
  return;
}

Assistant:

void NGA_Access_ghosts64(int g_a, int64_t dims[], void *ptr, int64_t ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM];
     Integer _ga_work[MAXDIM];

     wnga_access_ghost_ptr(a, _ga_lo, ptr, _ga_work);
     COPYF2C_64(_ga_work,ld, ndim-1);
     COPYF2C_64(_ga_lo, dims, ndim);
}